

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O1

void __thiscall ParserWrapper::~ParserWrapper(ParserWrapper *this)

{
  CharInStream *pCVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  pcVar2 = (this->lexer_).token_buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->lexer_).token_buffer_.field_2) {
    operator_delete(pcVar2);
  }
  p_Var3 = (this->lexer_).in_stream_.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pCVar1 = &(this->lexer_).in_stream_;
    (*p_Var3)((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
  }
  luna::String::~String(&this->name_);
  luna::State::~State(&this->state_);
  pcVar2 = (this->iss_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->iss_).str_.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

explicit ParserWrapper(const std::string &str = "")
        : iss_(str), state_(), name_("parser"),
          lexer_(&state_, &name_, std::bind(&io::text::InStringStream::GetChar, &iss_))
    {
    }